

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wrappers.c
# Opt level: O0

int wrapped_printf(char *format,...)

{
  char in_AL;
  long lVar1;
  undefined8 in_RCX;
  undefined8 in_RDX;
  undefined8 in_RSI;
  undefined8 in_R8;
  undefined8 in_R9;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  undefined1 local_138 [8];
  undefined8 local_130;
  undefined8 local_128;
  undefined8 local_120;
  undefined8 local_118;
  undefined8 local_110;
  undefined8 local_108;
  undefined8 local_f8;
  undefined8 local_e8;
  undefined8 local_d8;
  undefined8 local_c8;
  undefined8 local_b8;
  undefined8 local_a8;
  undefined8 local_98;
  int local_7c;
  long lStack_78;
  int return_val;
  curious_write_record_t io_args;
  curious_file_record_t *record;
  char *mount_point;
  char *filesystem;
  va_list args;
  vprintf_f orig_vprintf;
  char *format_local;
  
  if (in_AL != '\0') {
    local_108 = in_XMM0_Qa;
    local_f8 = in_XMM1_Qa;
    local_e8 = in_XMM2_Qa;
    local_d8 = in_XMM3_Qa;
    local_c8 = in_XMM4_Qa;
    local_b8 = in_XMM5_Qa;
    local_a8 = in_XMM6_Qa;
    local_98 = in_XMM7_Qa;
  }
  local_130 = in_RSI;
  local_128 = in_RDX;
  local_120 = in_RCX;
  local_118 = in_R8;
  local_110 = in_R9;
  lVar1 = __tls_get_addr(&PTR_00550710);
  *(int *)(lVar1 + 0xc) = *(int *)(lVar1 + 0xc) + 1;
  args[0].reg_save_area = gotcha_get_wrappee(io_fns[0x1d].handle);
  args[0].overflow_arg_area = local_138;
  args[0]._0_8_ = &stack0x00000008;
  filesystem._4_4_ = 0x30;
  filesystem._0_4_ = 8;
  lVar1 = __tls_get_addr(&PTR_00550710);
  if ((*(int *)(lVar1 + 0xc) == 1) && (wrappers_enabled != 0)) {
    io_args._32_8_ = get_curious_file_record(1);
    if ((curious_file_record_t *)io_args._32_8_ == (curious_file_record_t *)0x0) {
      mount_point = (char *)0x0;
      record = (curious_file_record_t *)0x0;
    }
    else {
      mount_point = ((curious_file_record_t *)io_args._32_8_)->filesystem;
      record = (curious_file_record_t *)((curious_file_record_t *)io_args._32_8_)->mount_point;
    }
    lStack_78 = 0;
    io_args.bytes_written._0_4_ = 0;
    io_args._8_8_ = mount_point;
    io_args.filesystem = (char *)record;
    io_args.mount_point._0_4_ = 0x1b;
    curious_call_callbacks(2,&stack0xffffffffffffff88);
    local_7c = (*(code *)args[0].reg_save_area)(format,&filesystem);
    io_args.bytes_written._0_4_ = 1;
    if (0 < local_7c) {
      lStack_78 = (long)local_7c;
    }
    curious_call_callbacks(3,&stack0xffffffffffffff88);
    lVar1 = __tls_get_addr(&PTR_00550710);
    *(int *)(lVar1 + 0xc) = *(int *)(lVar1 + 0xc) + -1;
    format_local._4_4_ = local_7c;
  }
  else {
    lVar1 = __tls_get_addr(&PTR_00550710);
    *(int *)(lVar1 + 0xc) = *(int *)(lVar1 + 0xc) + -1;
    format_local._4_4_ = (*(code *)args[0].reg_save_area)(format,&filesystem);
  }
  return format_local._4_4_;
}

Assistant:

int wrapped_printf(const char* format, ...)
{
    WRAPPER_ENTER(printf);

    // Get the handle for the original function
    vprintf_f orig_vprintf = (vprintf_f) gotcha_get_wrappee(io_fns[CURIOUS_VPRINTF_ID].handle);

    // Get the variable-length argument list set up
    va_list args;
    va_start(args, format);

    // Only call callbacks the first time around
    if (1 == wrapper_call_depth && wrappers_enabled) {
        char*                  filesystem;
        char*                  mount_point;
        curious_file_record_t* record = get_curious_file_record(STDOUT_FILENO);
        if (NULL == record) {
            filesystem  = NULL;
            mount_point = NULL;
        } else {
            filesystem  = record->filesystem;
            mount_point = record->mount_point;
        }

        curious_write_record_t io_args = {
            .bytes_written = 0,
            .call_count    = 0,
            .filesystem    = filesystem,
            .mount_point   = mount_point,
            .function_id   = CURIOUS_PRINTF_ID,
        };
        curious_call_callbacks(CURIOUS_WRITE_CALLBACK, &io_args);

        // Call the original, saving the result...
        int return_val     = orig_vprintf(format, args);
        io_args.call_count = 1;
        if (return_val > 0) {
            io_args.bytes_written = return_val;
        }

        //...for the pot callbacks to use
        curious_call_callbacks(CURIOUS_WRITE_CALLBACK | CURIOUS_POST_CALLBACK, &io_args);

        WRAPPER_RETURN(return_val, printf);

        // and just call the original function every other time
    } else {
        WRAPPER_RETURN(orig_vprintf(format, args), printf);
    }
}